

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O1

void __thiscall
flatbuffers::go::GoGenerator::GenNativeTableUnPack
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  BaseType BVar4;
  FieldDef *pFVar5;
  EnumDef *pEVar6;
  pointer pcVar7;
  StructDef *def;
  string *psVar8;
  long *plVar9;
  undefined8 *puVar10;
  ulong *puVar11;
  size_type *psVar12;
  long *plVar13;
  ulong uVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  pointer ppFVar17;
  string field_table;
  string field_field;
  string field_var;
  string length;
  string struct_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  StructDef *local_c8;
  IdlNamer *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  GoGenerator *local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pIVar1 = &this->namer_;
  local_c8 = struct_def;
  local_98 = this;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_50,pIVar1);
  std::operator+(&local_1f0,"func (rcv *",&local_50);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  paVar2 = &local_128.field_2;
  puVar11 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_128.field_2._M_allocated_capacity = *puVar11;
    local_128.field_2._8_4_ = (undefined4)plVar9[3];
    local_128.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
    local_128._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_128.field_2._M_allocated_capacity = *puVar11;
    local_128._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_128._M_string_length = plVar9[1];
  *plVar9 = (long)puVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&local_1d0,pIVar1,local_c8);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    uVar15 = local_128.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_1d0._M_string_length + local_128._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      uVar15 = local_1d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_1d0._M_string_length + local_128._M_string_length) goto LAB_0020e06e;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_1d0,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
  }
  else {
LAB_0020e06e:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_1d0._M_dataplus._M_p);
  }
  local_148 = &local_138;
  plVar9 = puVar10 + 2;
  if ((long *)*puVar10 == plVar9) {
    local_138 = *plVar9;
    lStack_130 = puVar10[3];
  }
  else {
    local_138 = *plVar9;
    local_148 = (long *)*puVar10;
  }
  local_140 = puVar10[1];
  *puVar10 = plVar9;
  puVar10[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_148);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_168.field_2._M_allocated_capacity = *psVar12;
    local_168.field_2._8_8_ = plVar9[3];
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar12;
    local_168._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_168._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,local_138 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_190 = code_ptr;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_c0 = pIVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  ppFVar17 = (local_c8->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar17 !=
      (local_c8->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pIVar1 = local_c0;
      pFVar5 = *ppFVar17;
      if (pFVar5->deprecated == false) {
        (*(local_c0->super_Namer)._vptr_Namer[0x12])(&local_168,local_c0,pFVar5);
        (*(pIVar1->super_Namer)._vptr_Namer[7])(&local_148,pIVar1,pFVar5);
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,local_148,(undefined1 *)(local_140 + (long)local_148));
        std::__cxx11::string::append((char *)&local_128);
        BVar4 = (pFVar5->value).type.base_type;
        if (BVar4 - BASE_TYPE_UTYPE < 0xc) {
          pEVar6 = (pFVar5->value).type.enum_def;
          if ((pEVar6 == (EnumDef *)0x0) || (pEVar6->is_union == false)) {
            std::operator+(&local_188,"\tt.",&local_168);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_188);
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1b0.field_2._M_allocated_capacity = *psVar12;
              local_1b0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_1b0.field_2._M_allocated_capacity = *psVar12;
              local_1b0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_1b0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_1b0,(ulong)local_168._M_dataplus._M_p);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            puVar11 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_1d0.field_2._M_allocated_capacity = *puVar11;
              local_1d0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *puVar11;
              local_1d0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_1d0._M_string_length = plVar9[1];
            *plVar9 = (long)puVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1f0.field_2._M_allocated_capacity = *psVar12;
              local_1f0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar12;
              local_1f0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1f0._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1f0._M_dataplus._M_p);
            goto LAB_0020f985;
          }
        }
        else {
          switch(BVar4) {
          case BASE_TYPE_STRING:
            std::operator+(&local_188,"\tt.",&local_168);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1b0.field_2._M_allocated_capacity = *psVar12;
              local_1b0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1b0.field_2._M_allocated_capacity = *psVar12;
              local_1b0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1b0._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_1b0,(ulong)local_168._M_dataplus._M_p);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            puVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_1d0.field_2._M_allocated_capacity = *puVar11;
              local_1d0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *puVar11;
              local_1d0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1d0._M_string_length = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1f0.field_2._M_allocated_capacity = *psVar12;
              local_1f0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar12;
              local_1f0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1f0._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1f0._M_dataplus._M_p);
            break;
          case BASE_TYPE_VECTOR:
          case BASE_TYPE_VECTOR64:
            if (((pFVar5->value).type.element != BASE_TYPE_UCHAR) ||
               ((pFVar5->value).type.enum_def != (EnumDef *)0x0)) {
              switch(BVar4) {
              case BASE_TYPE_VECTOR:
              case BASE_TYPE_VECTOR64:
                goto switchD_0020e380_caseD_e;
              case BASE_TYPE_STRUCT:
                goto switchD_0020e34a_caseD_f;
              case BASE_TYPE_UNION:
                goto switchD_0020e34a_caseD_10;
              default:
                goto switchD_0020e34a_caseD_11;
              }
            }
            std::operator+(&local_188,"\tt.",&local_168);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1b0.field_2._M_allocated_capacity = *psVar12;
              local_1b0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1b0.field_2._M_allocated_capacity = *psVar12;
              local_1b0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1b0._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_1b0,(ulong)local_168._M_dataplus._M_p);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            puVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_1d0.field_2._M_allocated_capacity = *puVar11;
              local_1d0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *puVar11;
              local_1d0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1d0._M_string_length = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1f0.field_2._M_allocated_capacity = *psVar12;
              local_1f0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar12;
              local_1f0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1f0._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1f0._M_dataplus._M_p);
            break;
          case BASE_TYPE_STRUCT:
switchD_0020e34a_caseD_f:
            std::operator+(&local_188,"\tt.",&local_168);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1b0.field_2._M_allocated_capacity = *psVar12;
              local_1b0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1b0.field_2._M_allocated_capacity = *psVar12;
              local_1b0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1b0._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_1b0,(ulong)local_168._M_dataplus._M_p);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            puVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_1d0.field_2._M_allocated_capacity = *puVar11;
              local_1d0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *puVar11;
              local_1d0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1d0._M_string_length = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1f0.field_2._M_allocated_capacity = *psVar12;
              local_1f0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar12;
              local_1f0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1f0._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1f0._M_dataplus._M_p);
            break;
          case BASE_TYPE_UNION:
switchD_0020e34a_caseD_10:
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1f0,local_148,(undefined1 *)(local_140 + (long)local_148));
            std::__cxx11::string::append((char *)&local_1f0);
            std::operator+(&local_1b0,"\t",&local_1f0);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_1b0);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1d0.field_2._M_allocated_capacity = *psVar12;
              local_1d0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *psVar12;
              local_1d0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_1d0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1
                             );
            }
            (*(local_c0->super_Namer)._vptr_Namer[4])(&local_e8,local_c0,pFVar5);
            plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,0x374fa3);
            local_108 = &local_f8;
            puVar11 = (ulong *)(plVar9 + 2);
            if ((ulong *)*plVar9 == puVar11) {
              local_f8 = *puVar11;
              lStack_f0 = plVar9[3];
            }
            else {
              local_f8 = *puVar11;
              local_108 = (ulong *)*plVar9;
            }
            local_100 = plVar9[1];
            *plVar9 = (long)puVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_108);
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_188.field_2._M_allocated_capacity = *psVar12;
              local_188.field_2._8_8_ = plVar9[3];
            }
            else {
              local_188.field_2._M_allocated_capacity = *psVar12;
              local_188._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_188._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_188,(ulong)local_1f0._M_dataplus._M_p);
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1b0.field_2._M_allocated_capacity = *psVar12;
              local_1b0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_1b0.field_2._M_allocated_capacity = *psVar12;
              local_1b0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_1b0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_1b0);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1d0.field_2._M_allocated_capacity = *psVar12;
              local_1d0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *psVar12;
              local_1d0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_1d0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_108 != &local_f8) {
              operator_delete(local_108,local_f8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            std::operator+(&local_b8,"\t\tt.",&local_168);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            puVar11 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_e8.field_2._M_allocated_capacity = *puVar11;
              local_e8.field_2._8_4_ = (undefined4)plVar9[3];
              local_e8.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
            }
            else {
              local_e8.field_2._M_allocated_capacity = *puVar11;
              local_e8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_e8._M_string_length = plVar9[1];
            *plVar9 = (long)puVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            local_70[0] = local_60;
            pcVar7 = (pFVar5->super_Definition).name._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_70,pcVar7,
                       pcVar7 + (pFVar5->super_Definition).name._M_string_length);
            std::__cxx11::string::append((char *)local_70);
            (*(local_98->namer_).super_Namer._vptr_Namer[0x14])
                      (&local_90,local_c0,(string *)local_70,
                       (ulong)(local_98->namer_).super_Namer.config_.methods);
            uVar15 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              uVar15 = local_e8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_88 + local_e8._M_string_length) {
              uVar14 = 0xf;
              if (local_90 != local_80) {
                uVar14 = local_80[0];
              }
              if (uVar14 < local_88 + local_e8._M_string_length) goto LAB_0020eb09;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_90,0,(char *)0x0,(ulong)local_e8._M_dataplus._M_p);
            }
            else {
LAB_0020eb09:
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_90);
            }
            local_108 = &local_f8;
            puVar11 = puVar10 + 2;
            if ((ulong *)*puVar10 == puVar11) {
              local_f8 = *puVar11;
              lStack_f0 = puVar10[3];
            }
            else {
              local_f8 = *puVar11;
              local_108 = (ulong *)*puVar10;
            }
            local_100 = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)puVar11 = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_108);
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_188.field_2._M_allocated_capacity = *psVar12;
              local_188.field_2._8_8_ = puVar10[3];
            }
            else {
              local_188.field_2._M_allocated_capacity = *psVar12;
              local_188._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_188._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_188,(ulong)local_1f0._M_dataplus._M_p);
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1b0.field_2._M_allocated_capacity = *psVar12;
              local_1b0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1b0.field_2._M_allocated_capacity = *psVar12;
              local_1b0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1b0._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            puVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_1d0.field_2._M_allocated_capacity = *puVar11;
              local_1d0.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *puVar11;
              local_1d0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1d0._M_string_length = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_108 != &local_f8) {
              operator_delete(local_108,local_f8 + 1);
            }
            if (local_90 != local_80) {
              operator_delete(local_90,local_80[0] + 1);
            }
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)local_190);
            uVar15 = local_1f0.field_2._M_allocated_capacity;
            _Var16._M_p = local_1f0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p == &local_1f0.field_2) goto LAB_0020f9fb;
            goto LAB_0020f9f3;
          default:
switchD_0020e34a_caseD_11:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                          ,0x501,
                          "void flatbuffers::go::GoGenerator::GenNativeTableUnPack(const StructDef &, std::string *)"
                         );
          }
LAB_0020f985:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          uVar15 = local_188.field_2._M_allocated_capacity;
          _Var16._M_p = local_188._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
LAB_0020f9f3:
            operator_delete(_Var16._M_p,uVar15 + 1);
          }
        }
LAB_0020f9fb:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if (local_148 != &local_138) {
          operator_delete(local_148,local_138 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
      }
      ppFVar17 = ppFVar17 + 1;
    } while (ppFVar17 !=
             (local_c8->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  psVar8 = local_190;
  std::__cxx11::string::append((char *)local_190);
  pIVar1 = local_c0;
  paVar2 = &local_128.field_2;
  paVar3 = &local_168.field_2;
  std::operator+(&local_1f0,"func (rcv *",&local_50);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  puVar11 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_128.field_2._M_allocated_capacity = *puVar11;
    local_128.field_2._8_4_ = (undefined4)plVar9[3];
    local_128.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
    local_128._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_128.field_2._M_allocated_capacity = *puVar11;
    local_128._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_128._M_string_length = plVar9[1];
  *plVar9 = (long)puVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&local_1d0,pIVar1,local_c8);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    uVar15 = local_128.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_1d0._M_string_length + local_128._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      uVar15 = local_1d0.field_2._M_allocated_capacity;
    }
    if (local_1d0._M_string_length + local_128._M_string_length <= (ulong)uVar15) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_1d0,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
      goto LAB_0020fc44;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_1d0._M_dataplus._M_p);
LAB_0020fc44:
  local_148 = &local_138;
  plVar9 = puVar10 + 2;
  if ((long *)*puVar10 == plVar9) {
    local_138 = *plVar9;
    lStack_130 = puVar10[3];
  }
  else {
    local_138 = *plVar9;
    local_148 = (long *)*puVar10;
  }
  local_140 = puVar10[1];
  *puVar10 = plVar9;
  puVar10[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_148);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_168.field_2._M_allocated_capacity = *psVar12;
    local_168.field_2._8_8_ = plVar9[3];
    local_168._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar12;
    local_168._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_168._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar8,(ulong)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar3) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,local_138 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)psVar8);
  (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&local_128,pIVar1,local_c8);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x374fe9);
  plVar13 = plVar9 + 2;
  if ((long *)*plVar9 == plVar13) {
    local_138 = *plVar13;
    lStack_130 = plVar9[3];
    local_148 = &local_138;
  }
  else {
    local_138 = *plVar13;
    local_148 = (long *)*plVar9;
  }
  local_140 = plVar9[1];
  *plVar9 = (long)plVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_148);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_168.field_2._M_allocated_capacity = *psVar12;
    local_168.field_2._8_8_ = plVar9[3];
    local_168._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar12;
    local_168._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_168._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar8,(ulong)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar3) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,local_138 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)psVar8);
  std::__cxx11::string::append((char *)psVar8);
  std::__cxx11::string::append((char *)psVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
switchD_0020e380_caseD_e:
  std::operator+(&local_188,"\t",&local_128);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1b0.field_2._M_allocated_capacity = *psVar12;
    local_1b0.field_2._8_8_ = plVar9[3];
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar12;
    local_1b0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_1b0._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1b0,(ulong)local_168._M_dataplus._M_p);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1d0.field_2._M_allocated_capacity = *psVar12;
    local_1d0.field_2._8_8_ = plVar9[3];
  }
  else {
    local_1d0.field_2._M_allocated_capacity = *psVar12;
    local_1d0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_1d0._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1f0.field_2._M_allocated_capacity = *psVar12;
    local_1f0.field_2._8_8_ = plVar9[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar12;
    local_1f0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_1f0._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1f0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_e8,"\tt.",&local_168);
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
  local_108 = &local_f8;
  puVar11 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar11) {
    local_f8 = *puVar11;
    lStack_f0 = puVar10[3];
  }
  else {
    local_f8 = *puVar11;
    local_108 = (ulong *)*puVar10;
  }
  local_100 = puVar10[1];
  *puVar10 = puVar11;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  NativeType_abi_cxx11_(&local_b8,local_98,&(pFVar5->value).type);
  uVar14 = 0xf;
  if (local_108 != &local_f8) {
    uVar14 = local_f8;
  }
  if (uVar14 < local_b8._M_string_length + local_100) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar15 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_b8._M_string_length + local_100) goto LAB_0020f191;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_108);
  }
  else {
LAB_0020f191:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_b8._M_dataplus._M_p);
  }
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  psVar12 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_188.field_2._M_allocated_capacity = *psVar12;
    local_188.field_2._8_8_ = puVar10[3];
  }
  else {
    local_188.field_2._M_allocated_capacity = *psVar12;
    local_188._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_188._M_string_length = puVar10[1];
  *puVar10 = psVar12;
  puVar10[1] = 0;
  *(undefined1 *)psVar12 = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  psVar12 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1b0.field_2._M_allocated_capacity = *psVar12;
    local_1b0.field_2._8_8_ = puVar10[3];
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar12;
    local_1b0._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_1b0._M_string_length = puVar10[1];
  *puVar10 = psVar12;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_128._M_dataplus._M_p);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  puVar11 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_1d0.field_2._M_allocated_capacity = *puVar11;
    local_1d0.field_2._8_8_ = puVar10[3];
  }
  else {
    local_1d0.field_2._M_allocated_capacity = *puVar11;
    local_1d0._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_1d0._M_string_length = puVar10[1];
  *puVar10 = puVar11;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1f0.field_2._M_allocated_capacity = *psVar12;
    local_1f0.field_2._8_8_ = plVar9[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar12;
    local_1f0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_1f0._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1f0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_1d0,"\tfor j := 0; j < ",&local_128);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1f0.field_2._M_allocated_capacity = *psVar12;
    local_1f0.field_2._8_8_ = plVar9[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar12;
    local_1f0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_1f0._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1f0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((pFVar5->value).type.element == BASE_TYPE_STRUCT) {
    def = (pFVar5->value).type.struct_def;
    WrapInNameSpaceAndTrack(&local_1b0,local_98,&def->super_Definition,(string *)def);
    puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x374ef1);
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    puVar11 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_1d0.field_2._M_allocated_capacity = *puVar11;
      local_1d0.field_2._8_8_ = puVar10[3];
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *puVar11;
      local_1d0._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_1d0._M_string_length = puVar10[1];
    *puVar10 = puVar11;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_1d0);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_1f0.field_2._M_allocated_capacity = *psVar12;
      local_1f0.field_2._8_8_ = plVar9[3];
    }
    else {
      local_1f0.field_2._M_allocated_capacity = *psVar12;
      local_1f0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1f0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_1d0,"\t\trcv.",&local_168);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_1d0);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_1f0.field_2._M_allocated_capacity = *psVar12;
      local_1f0.field_2._8_8_ = plVar9[3];
    }
    else {
      local_1f0.field_2._M_allocated_capacity = *psVar12;
      local_1f0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1f0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  std::operator+(&local_1d0,"\t\tt.",&local_168);
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar12 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1f0.field_2._M_allocated_capacity = *psVar12;
    local_1f0.field_2._8_8_ = puVar10[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar12;
    local_1f0._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_1f0._M_string_length = puVar10[1];
  *puVar10 = psVar12;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1f0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  BVar4 = (pFVar5->value).type.element;
  if (BVar4 - BASE_TYPE_UTYPE < 0xc) {
    std::operator+(&local_1d0,"rcv.",&local_168);
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    psVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_1f0.field_2._M_allocated_capacity = *psVar12;
      local_1f0.field_2._8_8_ = puVar10[3];
    }
    else {
      local_1f0.field_2._M_allocated_capacity = *psVar12;
      local_1f0._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_1f0._M_string_length = puVar10[1];
    *puVar10 = psVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1f0._M_dataplus._M_p);
LAB_0020faba:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (BVar4 != BASE_TYPE_STRUCT) {
      if (BVar4 != BASE_TYPE_STRING) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                      ,0x4f0,
                      "void flatbuffers::go::GoGenerator::GenNativeTableUnPack(const StructDef &, std::string *)"
                     );
      }
      std::operator+(&local_1d0,"string(rcv.",&local_168);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_1f0.field_2._M_allocated_capacity = *psVar12;
        local_1f0.field_2._8_8_ = puVar10[3];
      }
      else {
        local_1f0.field_2._M_allocated_capacity = *psVar12;
        local_1f0._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_1f0._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1f0._M_dataplus._M_p);
      goto LAB_0020faba;
    }
    std::__cxx11::string::append((char *)local_190);
  }
  std::__cxx11::string::append((char *)local_190);
  std::__cxx11::string::append((char *)local_190);
  goto LAB_0020f9fb;
}

Assistant:

void GenNativeTableUnPack(const StructDef &struct_def,
                            std::string *code_ptr) {
    std::string &code = *code_ptr;
    const std::string struct_type = namer_.Type(struct_def);

    code += "func (rcv *" + struct_type + ") UnPackTo(t *" +
            NativeName(struct_def) + ") {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.deprecated) continue;
      const std::string field_field = namer_.Field(field);
      const std::string field_var = namer_.Variable(field);
      const std::string length = field_var + "Length";
      if (IsScalar(field.value.type.base_type)) {
        if (field.value.type.enum_def != nullptr &&
            field.value.type.enum_def->is_union)
          continue;
        code += "\tt." + field_field + " = rcv." + field_field + "()\n";
      } else if (IsString(field.value.type)) {
        code += "\tt." + field_field + " = string(rcv." + field_field + "())\n";
      } else if (IsVector(field.value.type) &&
                 field.value.type.element == BASE_TYPE_UCHAR &&
                 field.value.type.enum_def == nullptr) {
        code += "\tt." + field_field + " = rcv." + field_field + "Bytes()\n";
      } else if (IsVector(field.value.type)) {
        code += "\t" + length + " := rcv." + field_field + "Length()\n";
        code += "\tt." + field_field + " = make(" +
                NativeType(field.value.type) + ", " + length + ")\n";
        code += "\tfor j := 0; j < " + length + "; j++ {\n";
        if (field.value.type.element == BASE_TYPE_STRUCT) {
          code += "\t\tx := " +
                  WrapInNameSpaceAndTrack(field.value.type.struct_def,
                                          field.value.type.struct_def->name) +
                  "{}\n";
          code += "\t\trcv." + field_field + "(&x, j)\n";
        }
        code += "\t\tt." + field_field + "[j] = ";
        if (IsScalar(field.value.type.element)) {
          code += "rcv." + field_field + "(j)";
        } else if (field.value.type.element == BASE_TYPE_STRING) {
          code += "string(rcv." + field_field + "(j))";
        } else if (field.value.type.element == BASE_TYPE_STRUCT) {
          code += "x.UnPack()";
        } else {
          // TODO(iceboy): Support vector of unions.
          FLATBUFFERS_ASSERT(0);
        }
        code += "\n";
        code += "\t}\n";
      } else if (field.value.type.base_type == BASE_TYPE_STRUCT) {
        code +=
            "\tt." + field_field + " = rcv." + field_field + "(nil).UnPack()\n";
      } else if (field.value.type.base_type == BASE_TYPE_UNION) {
        const std::string field_table = field_var + "Table";
        code += "\t" + field_table + " := flatbuffers.Table{}\n";
        code +=
            "\tif rcv." + namer_.Method(field) + "(&" + field_table + ") {\n";
        code += "\t\tt." + field_field + " = rcv." +
                namer_.Method(field.name + UnionTypeFieldSuffix()) +
                "().UnPack(" + field_table + ")\n";
        code += "\t}\n";
      } else {
        FLATBUFFERS_ASSERT(0);
      }
    }
    code += "}\n\n";

    code += "func (rcv *" + struct_type + ") UnPack() *" +
            NativeName(struct_def) + " {\n";
    code += "\tif rcv == nil {\n\t\treturn nil\n\t}\n";
    code += "\tt := &" + NativeName(struct_def) + "{}\n";
    code += "\trcv.UnPackTo(t)\n";
    code += "\treturn t\n";
    code += "}\n\n";
  }